

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O2

void nghttp2_frame_unpack_priority_update_payload
               (nghttp2_extension *frame,uint8_t *payload,size_t payloadlen)

{
  uint *puVar1;
  uint32_t uVar2;
  uint8_t *puVar3;
  
  if (3 < payloadlen) {
    puVar1 = (uint *)frame->payload;
    uVar2 = nghttp2_get_uint32(payload);
    *puVar1 = uVar2 & 0x7fffffff;
    puVar3 = (uint8_t *)0x0;
    if (payloadlen != 4) {
      puVar3 = payload + 4;
    }
    *(uint8_t **)(puVar1 + 2) = puVar3;
    *(size_t *)(puVar1 + 4) = payloadlen - 4;
    return;
  }
  __assert_fail("payloadlen >= 4",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_frame.c"
                ,0x3ab,
                "void nghttp2_frame_unpack_priority_update_payload(nghttp2_extension *, uint8_t *, size_t)"
               );
}

Assistant:

void nghttp2_frame_unpack_priority_update_payload(nghttp2_extension *frame,
                                                  uint8_t *payload,
                                                  size_t payloadlen) {
  nghttp2_ext_priority_update *priority_update;

  assert(payloadlen >= 4);

  priority_update = frame->payload;

  priority_update->stream_id =
      nghttp2_get_uint32(payload) & NGHTTP2_STREAM_ID_MASK;

  if (payloadlen > 4) {
    priority_update->field_value = payload + 4;
    priority_update->field_value_len = payloadlen - 4;
  } else {
    priority_update->field_value = NULL;
    priority_update->field_value_len = 0;
  }
}